

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int whereLoopIsOneRow(WhereLoop *pLoop)

{
  ushort uVar1;
  Index *pIVar2;
  int iVar3;
  ulong uVar4;
  
  pIVar2 = (pLoop->u).btree.pIndex;
  iVar3 = 0;
  if ((((pIVar2->onError != '\0') && (pLoop->nSkip == 0)) &&
      (uVar1 = (pLoop->u).btree.nEq, uVar1 == pIVar2->nKeyCol)) && (iVar3 = 1, (ulong)uVar1 != 0)) {
    uVar4 = 0;
    do {
      if ((pLoop->aLTerm[uVar4]->eOperator & 0x180) != 0) {
        return 0;
      }
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  return iVar3;
}

Assistant:

static int whereLoopIsOneRow(WhereLoop *pLoop){
  if( pLoop->u.btree.pIndex->onError
   && pLoop->nSkip==0
   && pLoop->u.btree.nEq==pLoop->u.btree.pIndex->nKeyCol
  ){
    int ii;
    for(ii=0; ii<pLoop->u.btree.nEq; ii++){
      if( pLoop->aLTerm[ii]->eOperator & (WO_IS|WO_ISNULL) ){
        return 0;
      }
    }
    return 1;
  }
  return 0;
}